

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  LogMessage *other;
  int local_6c;
  LogFinisher local_65;
  int count;
  byte local_51;
  LogMessage local_50;
  char *local_18;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_51 = 0;
  local_18 = ptr;
  ptr_local = (char *)this;
  if (this->buffer_end_ + 0x10 < ptr) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
               ,0x75);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: ptr <= buffer_end_ + kSlopBytes: ");
    LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  if (this->next_chunk_ == this->buffer_) {
    local_6c = ((int)this->buffer_end_ + 0x10) - (int)local_18;
  }
  else {
    local_6c = this->size_ + ((int)this->buffer_end_ - (int)local_18);
  }
  if (0 < local_6c) {
    StreamBackUp(this,local_6c);
  }
  return;
}

Assistant:

void BackUp(const char* ptr) {
    GOOGLE_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }